

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O2

GdlExpression * __thiscall
GdlBinaryExpression::SimplifyAndUnscale
          (GdlBinaryExpression *this,GrcGlyphAttrMatrix *pgax,gid16 wGlyphID,SymbolSet *setpsym,
          GrcFont *pfont,bool fGAttrDefChk,bool *pfCanSub)

{
  int iVar1;
  undefined4 extraout_var;
  GdlExpression *pGVar3;
  GdlBinaryExpression *this_00;
  undefined6 in_register_00000012;
  GdlExpression *pGVar4;
  undefined7 in_register_00000089;
  bool fCanSubOperand2;
  bool fCanSubOperand1;
  int nValue;
  GdlExpression *pGVar2;
  undefined4 extraout_var_00;
  
  iVar1 = (*this->m_pexpOperand1->_vptr_GdlExpression[0xf])();
  pGVar2 = (GdlExpression *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*this->m_pexpOperand2->_vptr_GdlExpression[0xf])
                    (this->m_pexpOperand2,pgax,CONCAT62(in_register_00000012,wGlyphID) & 0xffffffff,
                     setpsym,pfont,CONCAT71(in_register_00000089,fGAttrDefChk) & 0xffffffff,
                     &fCanSubOperand2);
  pGVar3 = (GdlExpression *)CONCAT44(extraout_var_00,iVar1);
  this_00 = (GdlBinaryExpression *)0x0;
  if ((pGVar2 != (GdlExpression *)0x0) && (pGVar3 != (GdlExpression *)0x0)) {
    pGVar4 = this->m_pexpOperand1;
    this_00 = this;
    if (pGVar2 != pGVar4) {
      if (fCanSubOperand1 == false) {
        iVar1 = (**(this->super_GdlExpression)._vptr_GdlExpression)(this);
        this_00 = (GdlBinaryExpression *)__dynamic_cast(iVar1,&GdlExpression::typeinfo,&typeinfo,0);
        pGVar4 = this_00->m_pexpOperand1;
      }
      if (pGVar4 != (GdlExpression *)0x0) {
        (*pGVar4->_vptr_GdlExpression[2])();
      }
      this_00->m_pexpOperand1 = pGVar2;
    }
    if (pGVar3 != this->m_pexpOperand2) {
      if ((this_00 == this) && (fCanSubOperand2 == false)) {
        iVar1 = (**(this->super_GdlExpression)._vptr_GdlExpression)(this);
        this_00 = (GdlBinaryExpression *)__dynamic_cast(iVar1,&GdlExpression::typeinfo,&typeinfo,0);
      }
      if (this_00->m_pexpOperand2 != (GdlExpression *)0x0) {
        (*this_00->m_pexpOperand2->_vptr_GdlExpression[2])();
      }
      this_00->m_pexpOperand2 = pGVar3;
    }
    *pfCanSub = this_00 == this;
    iVar1 = (*(this->super_GdlExpression)._vptr_GdlExpression[7])(this,&nValue,0);
    if ((char)iVar1 != '\0') {
      this_00 = (GdlBinaryExpression *)operator_new(0x40);
      GdlNumericExpression::GdlNumericExpression((GdlNumericExpression *)this_00,nValue);
      GrpLineAndFile::operator=
                (&(this_00->super_GdlExpression).super_GdlObject.m_lnf,
                 &(this->super_GdlExpression).super_GdlObject.m_lnf);
    }
  }
  return &this_00->super_GdlExpression;
}

Assistant:

GdlExpression * GdlBinaryExpression::SimplifyAndUnscale(GrcGlyphAttrMatrix * pgax,
	gid16 wGlyphID, SymbolSet & setpsym, GrcFont * pfont, bool fGAttrDefChk,
	bool * pfCanSub)
{
	bool fCanSubOperand1, fCanSubOperand2;
	GdlExpression * pexpOperand1New =
		m_pexpOperand1->SimplifyAndUnscale(pgax, wGlyphID, setpsym, pfont,
			fGAttrDefChk, &fCanSubOperand1);
	GdlExpression * pexpOperand2New =
		m_pexpOperand2->SimplifyAndUnscale(pgax, wGlyphID, setpsym, pfont,
			fGAttrDefChk, &fCanSubOperand2);

	if (!pexpOperand1New || !pexpOperand2New)
		return NULL;

	GdlBinaryExpression * pexpbinRet = this;

	if (pexpOperand1New && pexpOperand1New != m_pexpOperand1)
	{
		if (!fCanSubOperand1)
		{
			pexpbinRet = dynamic_cast<GdlBinaryExpression *>(this->Clone());
			Assert(pexpbinRet);
		}
		delete pexpbinRet->m_pexpOperand1;
		pexpbinRet->m_pexpOperand1 = pexpOperand1New;
	}
	if (pexpOperand2New && pexpOperand2New != m_pexpOperand2)
	{
		if (!fCanSubOperand2 && pexpbinRet == this)
		{
			pexpbinRet = dynamic_cast<GdlBinaryExpression *>(this->Clone());
			Assert(pexpbinRet);
		}
		delete pexpbinRet->m_pexpOperand2;
		pexpbinRet->m_pexpOperand2 = pexpOperand2New;
	}
	*pfCanSub = (pexpbinRet == this);

	int nValue;
	if (this->ResolveToInteger(&nValue, false))
	{
		GdlExpression * pexpRet = new GdlNumericExpression(nValue);
		pexpRet->CopyLineAndFile(*this);
		return pexpRet;
	}

	return pexpbinRet;
}